

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRefactor.c
# Opt level: O1

Abc_ManRef_t * Abc_NtkManRefStart(int nNodeSizeMax,int nConeSizeMax,int fUseDcs,int fVerbose)

{
  undefined4 uVar1;
  void *pvVar2;
  int iVar3;
  Abc_ManRef_t *__s;
  Vec_Str_t *pVVar4;
  char *pcVar5;
  Vec_Ptr_t *pVVar6;
  void **ppvVar7;
  long lVar8;
  Vec_Int_t *pVVar9;
  int *piVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  
  __s = (Abc_ManRef_t *)malloc(0xa8);
  uVar14 = 0;
  memset(__s,0,0xa8);
  pVVar4 = (Vec_Str_t *)malloc(0x10);
  pVVar4->nCap = 100;
  pVVar4->nSize = 0;
  pcVar5 = (char *)malloc(100);
  pVVar4->pArray = pcVar5;
  __s->vCube = pVVar4;
  pVVar6 = (Vec_Ptr_t *)malloc(0x10);
  pVVar6->nCap = 100;
  pVVar6->nSize = 0;
  ppvVar7 = (void **)malloc(800);
  pVVar6->pArray = ppvVar7;
  __s->vVisited = pVVar6;
  __s->nNodeSizeMax = nNodeSizeMax;
  __s->nConeSizeMax = nConeSizeMax;
  __s->fVerbose = fVerbose;
  uVar15 = 6;
  if (6 < nNodeSizeMax) {
    uVar15 = (ulong)(uint)nNodeSizeMax;
  }
  iVar3 = (int)uVar15;
  iVar11 = iVar3 + -5;
  uVar13 = 1 << ((byte)iVar11 & 0x1f);
  ppvVar7 = (void **)malloc(((long)(int)uVar13 * 4 + 8) * uVar15);
  lVar8 = uVar15 * 8;
  do {
    ppvVar7[uVar14] = (void *)((long)ppvVar7 + lVar8);
    uVar14 = uVar14 + 1;
    lVar8 = lVar8 + (long)(int)uVar13 * 4;
  } while (uVar15 != uVar14);
  pVVar6 = (Vec_Ptr_t *)malloc(0x10);
  pVVar6->nSize = iVar3;
  pVVar6->nCap = iVar3;
  pVVar6->pArray = ppvVar7;
  uVar14 = 0;
  do {
    pvVar2 = ppvVar7[uVar14];
    if (uVar14 < 5) {
      if (iVar11 != 0x1f) {
        uVar1 = (&DAT_00826ae0)[uVar14];
        uVar12 = 0;
        do {
          *(undefined4 *)((long)pvVar2 + uVar12 * 4) = uVar1;
          uVar12 = uVar12 + 1;
        } while (uVar13 != uVar12);
      }
    }
    else if (iVar11 != 0x1f) {
      uVar12 = 0;
      do {
        *(uint *)((long)pvVar2 + uVar12 * 4) =
             -(uint)((1 << ((char)uVar14 - 5U & 0x1f) & (uint)uVar12) != 0);
        uVar12 = uVar12 + 1;
      } while (uVar13 != uVar12);
    }
    uVar14 = uVar14 + 1;
  } while (uVar14 != uVar15);
  __s->vVars = pVVar6;
  pVVar6 = (Vec_Ptr_t *)malloc(0x10);
  pVVar6->nCap = 100;
  pVVar6->nSize = 0;
  ppvVar7 = (void **)malloc(800);
  pVVar6->pArray = ppvVar7;
  __s->vFuncs = pVVar6;
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  pVVar9->nCap = 0x10000;
  pVVar9->nSize = 0;
  piVar10 = (int *)malloc(0x40000);
  pVVar9->pArray = piVar10;
  __s->vMemory = pVVar9;
  return __s;
}

Assistant:

Abc_ManRef_t * Abc_NtkManRefStart( int nNodeSizeMax, int nConeSizeMax, int fUseDcs, int fVerbose )
{
    Abc_ManRef_t * p;
    p = ABC_ALLOC( Abc_ManRef_t, 1 );
    memset( p, 0, sizeof(Abc_ManRef_t) );
    p->vCube        = Vec_StrAlloc( 100 );
    p->vVisited     = Vec_PtrAlloc( 100 );
    p->nNodeSizeMax = nNodeSizeMax;
    p->nConeSizeMax = nConeSizeMax;
    p->fVerbose     = fVerbose;
    p->vVars        = Vec_PtrAllocTruthTables( Abc_MaxInt(nNodeSizeMax, 6) );
    p->vFuncs       = Vec_PtrAlloc( 100 );
    p->vMemory      = Vec_IntAlloc( 1 << 16 );
    return p;
}